

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::Trace(GlobOpt *this,BasicBlock *block,bool before)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  BasicBlock *pBVar13;
  undefined4 *puVar14;
  char16_t *pcVar15;
  uint local_54;
  bool local_22;
  bool anyTrace;
  bool fieldPRETrace;
  bool valueTableTrace;
  bool objTypeSpecTrace;
  bool fieldCopyPropTrace;
  bool floatTypeSpecTrace;
  bool typeSpecTrace;
  bool globOptTrace;
  bool before_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypeSpecPhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FloatTypeSpecPhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldCopyPropPhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ValueTablePhase,uVar9,uVar10);
  uVar9 = Func::GetSourceContextId(this->func);
  uVar10 = Func::GetLocalFunctionId(this->func);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldPREPhase,uVar9,uVar10);
  local_22 = true;
  if ((((!bVar2) && (local_22 = true, !bVar3)) && (local_22 = true, !bVar4)) &&
     (((local_22 = true, !bVar5 && (local_22 = true, !bVar6)) && (local_22 = true, !bVar7)))) {
    local_22 = bVar8;
  }
  if (local_22 != false) {
    if (((bVar8) && (bVar2 = IsLoopPrePass(this), bVar2)) &&
       (((*(ushort *)&block->field_0x18 >> 2 & 1) != 0 && (before)))) {
      pBVar13 = Loop::GetHeadBlock(this->prePassLoop);
      uVar12 = BasicBlock::GetBlockNum(pBVar13);
      uVar11 = BasicBlock::GetBlockNum(block);
      Output::Print(L"====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n",
                    (ulong)uVar12,(ulong)uVar11);
    }
    if ((((bVar3) || (bVar4)) || (bVar7)) || ((DAT_01ec73ca & 1) != 0)) {
      if (before) {
        Output::Print(L"========================================================================\n")
        ;
        uVar12 = BasicBlock::GetBlockNum(block);
        Output::Print(L"Begin OptBlock: Block #%-3d",(ulong)uVar12);
        if (block->loop != (Loop *)0x0) {
          pBVar13 = Loop::GetHeadBlock(block->loop);
          uVar12 = BasicBlock::GetBlockNum(pBVar13);
          if (this->prePassLoop == (Loop *)0x0) {
            local_54 = 0;
          }
          else {
            pBVar13 = Loop::GetHeadBlock(this->prePassLoop);
            local_54 = BasicBlock::GetBlockNum(pBVar13);
          }
          bVar2 = IsLoopPrePass(this);
          pcVar15 = L"";
          if (bVar2) {
            pcVar15 = L"PrePass";
          }
          Output::Print(L"     Loop block header:%-3d  currentLoop block head:%-3d   %s",
                        (ulong)uVar12,(ulong)local_54,pcVar15);
        }
        Output::Print(L"\n");
      }
      else {
        Output::Print(L"-----------------------------------------------------------------------\n");
        uVar12 = BasicBlock::GetBlockNum(block);
        Output::Print(L"After OptBlock: Block #%-3d\n",(ulong)uVar12);
      }
      if (((bVar3) || (bVar4)) &&
         (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveVarSyms),
         !bVar2)) {
        Output::Print(L"    Live var syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveVarSyms);
      }
      if ((bVar3) &&
         (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveInt32Syms),
         !bVar2)) {
        bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x4145,"(this->tempBv->IsEmpty())","this->tempBv->IsEmpty()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (this->tempBv,(block->globOptData).liveInt32Syms,
                   (block->globOptData).liveLossyInt32Syms);
        bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this->tempBv);
        if (!bVar2) {
          Output::Print(L"    Int32 type specialized (lossless) syms: ");
          BVSparse<Memory::JitArenaAllocator>::Dump(this->tempBv);
        }
        BVSparse<Memory::JitArenaAllocator>::ClearAll(this->tempBv);
        bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((block->globOptData).liveLossyInt32Syms);
        if (!bVar2) {
          Output::Print(L"    Int32 converted (lossy) syms: ");
          BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveLossyInt32Syms);
        }
      }
      if ((bVar4) &&
         (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFloat64Syms)
         , !bVar2)) {
        Output::Print(L"    Float64 type specialized syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFloat64Syms);
      }
      if ((((bVar5) || (bVar6)) && (bVar2 = DoFieldCopyProp(this,block->loop), bVar2)) &&
         (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFields),
         !bVar2)) {
        Output::Print(L"    Live field syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFields);
      }
      if ((bVar6) || (bVar7)) {
        Output::Print(L"    Value table:\n");
        GlobOptBlockData::DumpSymToValueMap(&block->globOptData);
      }
      if (before) {
        Output::Print(L"-----------------------------------------------------------------------\n");
      }
      Output::Flush();
    }
  }
  return;
}

Assistant:

void
GlobOpt::Trace(BasicBlock * block, bool before) const
{
    bool globOptTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool typeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::TypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool floatTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FloatTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldCopyPropTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool objTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ObjTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool valueTableTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ValueTablePhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldPRETrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());

    bool anyTrace = globOptTrace || typeSpecTrace || floatTypeSpecTrace || fieldCopyPropTrace || objTypeSpecTrace || valueTableTrace || fieldPRETrace;

    if (!anyTrace)
    {
        return;
    }

    if (fieldPRETrace && this->IsLoopPrePass())
    {
        if (block->isLoopHeader && before)
        {
            Output::Print(_u("====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n"),
                this->prePassLoop->GetHeadBlock()->GetBlockNum(), block->GetBlockNum());
        }
    }

    if (!typeSpecTrace && !floatTypeSpecTrace && !valueTableTrace && !Js::Configuration::Global.flags.Verbose)
    {
        return;
    }

    if (before)
    {
        Output::Print(_u("========================================================================\n"));
        Output::Print(_u("Begin OptBlock: Block #%-3d"), block->GetBlockNum());
        if (block->loop)
        {
            Output::Print(_u("     Loop block header:%-3d  currentLoop block head:%-3d   %s"),
                block->loop->GetHeadBlock()->GetBlockNum(),
                this->prePassLoop ? this->prePassLoop->GetHeadBlock()->GetBlockNum() : 0,
                this->IsLoopPrePass() ? _u("PrePass") : _u(""));
        }
        Output::Print(_u("\n"));
    }
    else
    {
        Output::Print(_u("-----------------------------------------------------------------------\n"));
        Output::Print(_u("After OptBlock: Block #%-3d\n"), block->GetBlockNum());
    }
    if ((typeSpecTrace || floatTypeSpecTrace) && !block->globOptData.liveVarSyms->IsEmpty())
    {
        Output::Print(_u("    Live var syms: "));
        block->globOptData.liveVarSyms->Dump();
    }
    if (typeSpecTrace && !block->globOptData.liveInt32Syms->IsEmpty())
    {
        Assert(this->tempBv->IsEmpty());
        this->tempBv->Minus(block->globOptData.liveInt32Syms, block->globOptData.liveLossyInt32Syms);
        if(!this->tempBv->IsEmpty())
        {
            Output::Print(_u("    Int32 type specialized (lossless) syms: "));
            this->tempBv->Dump();
        }
        this->tempBv->ClearAll();
        if(!block->globOptData.liveLossyInt32Syms->IsEmpty())
        {
            Output::Print(_u("    Int32 converted (lossy) syms: "));
            block->globOptData.liveLossyInt32Syms->Dump();
        }
    }
    if (floatTypeSpecTrace && !block->globOptData.liveFloat64Syms->IsEmpty())
    {
        Output::Print(_u("    Float64 type specialized syms: "));
        block->globOptData.liveFloat64Syms->Dump();
    }
    if ((fieldCopyPropTrace || objTypeSpecTrace) && this->DoFieldCopyProp(block->loop) && !block->globOptData.liveFields->IsEmpty())
    {
        Output::Print(_u("    Live field syms: "));
        block->globOptData.liveFields->Dump();
    }
    if (objTypeSpecTrace || valueTableTrace)
    {
        Output::Print(_u("    Value table:\n"));
        block->globOptData.DumpSymToValueMap();
    }

    if (before)
    {
        Output::Print(_u("-----------------------------------------------------------------------\n")); \
    }

    Output::Flush();
}